

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O2

uint64 CityHash64WithSeeds(char *s,size_t len,uint64 seed0,uint64 seed1)

{
  uint64 uVar1;
  
  uVar1 = CityHash64(s,len);
  uVar1 = HashLen16(uVar1 - seed0,seed1);
  return uVar1;
}

Assistant:

uint64 CityHash64WithSeeds(const char *s, size_t len,
                           uint64 seed0, uint64 seed1) {
  return HashLen16(CityHash64(s, len) - seed0, seed1);
}